

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O1

void __thiscall
TTD::RuntimeContextInfo::MarkWellKnownObjects_TTD(RuntimeContextInfo *this,MarkTable *marks)

{
  MarkTableTag MVar1;
  int32 iVar2;
  RecyclableObject **ppRVar3;
  FunctionBody **ppFVar4;
  int iVar5;
  
  if (0 < (this->m_sortedObjectList).
          super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>.count)
  {
    iVar5 = 0;
    do {
      ppRVar3 = JsUtil::ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>
                ::Item(&(this->m_sortedObjectList).
                        super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>
                       ,iVar5);
      iVar2 = MarkTable::FindIndexForKey(marks,(uint64)*ppRVar3);
      MVar1 = marks->m_markArray[iVar2];
      if (MVar1 != Clear) {
        marks->m_markArray[iVar2] = MVar1 | JsWellKnownObj;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < (this->m_sortedObjectList).
                     super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>
                     .count);
  }
  if (0 < (this->m_sortedFunctionBodyList).
          super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>.count) {
    iVar5 = 0;
    do {
      ppFVar4 = JsUtil::ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>::
                Item(&(this->m_sortedFunctionBodyList).
                      super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>
                     ,iVar5);
      iVar2 = MarkTable::FindIndexForKey(marks,(uint64)*ppFVar4);
      MVar1 = marks->m_markArray[iVar2];
      if (MVar1 != Clear) {
        marks->m_markArray[iVar2] = MVar1 | JsWellKnownObj;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < (this->m_sortedFunctionBodyList).
                     super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>.
                     count);
  }
  return;
}

Assistant:

void RuntimeContextInfo::MarkWellKnownObjects_TTD(MarkTable& marks) const
    {
        for(int32 i = 0; i < this->m_sortedObjectList.Count(); ++i)
        {
            Js::RecyclableObject* obj = this->m_sortedObjectList.Item(i);
            marks.MarkAddrWithSpecialInfo<MarkTableTag::JsWellKnownObj>(obj);
        }

        for(int32 i = 0; i < this->m_sortedFunctionBodyList.Count(); ++i)
        {
            Js::FunctionBody* body = this->m_sortedFunctionBodyList.Item(i);
            marks.MarkAddrWithSpecialInfo<MarkTableTag::JsWellKnownObj>(body);
        }
    }